

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf-parser.cc
# Opt level: O0

void __thiscall elf_parser::Elf_parser::load_memory_map(Elf_parser *this)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  uint8_t *puVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  int local_a4;
  undefined1 local_a0 [4];
  int fd;
  stat st;
  Elf_parser *this_local;
  
  st.__glibc_reserved[2] = (__syscall_slong_t)this;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  local_a4 = open(pcVar2,2);
  if (local_a4 < 0) {
    std::operator+(&local_e8,&this->_last_error,"open failed: ");
    piVar3 = __errno_location();
    pcVar2 = strerror(*piVar3);
    std::operator+(&local_c8,&local_e8,pcVar2);
    std::__cxx11::string::operator=((string *)&this->_last_error,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    this->_failed = true;
  }
  else {
    iVar1 = fstat(local_a4,(stat *)local_a0);
    if (iVar1 < 0) {
      std::operator+(&local_138,&this->_last_error,"stat failed: ");
      piVar3 = __errno_location();
      pcVar2 = strerror(*piVar3);
      std::operator+(&local_118,&local_138,pcVar2);
      std::__cxx11::string::operator=((string *)&this->_last_error,(string *)&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_138);
      this->_failed = true;
    }
    puVar4 = (uint8_t *)mmap((void *)0x0,st.st_rdev,3,2,local_a4,0);
    this->m_mmap_program = puVar4;
    if (this->m_mmap_program == (uint8_t *)0xffffffffffffffff) {
      std::operator+(&local_178,&this->_last_error,"mmap failed: ");
      piVar3 = __errno_location();
      pcVar2 = strerror(*piVar3);
      std::operator+(&local_158,&local_178,pcVar2);
      std::__cxx11::string::operator=((string *)&this->_last_error,(string *)&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_178);
      this->_failed = true;
    }
    this->_failed = false;
  }
  return;
}

Assistant:

void Elf_parser::load_memory_map()
{
    struct stat st;
    int fd;

    if ((fd = open(m_program_path.c_str(), O_RDWR)) < 0) {
       	_last_error = _last_error + "open failed: " + strerror(errno);
	_failed = true;
	return;
    }

    if (fstat(fd, &st) < 0) {
       	_last_error = _last_error + "stat failed: " + strerror(errno);
	_failed = true;
    }

    m_mmap_program = static_cast<uint8_t*>(mmap(NULL, st.st_size, PROT_READ | PROT_WRITE, MAP_PRIVATE, fd, 0));
    if (m_mmap_program == MAP_FAILED) {
       	_last_error = _last_error + "mmap failed: " + strerror(errno);
	_failed = true;
    }

    _failed = false;
}